

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

const_iterator * __thiscall
compressed_sparse_matrix<int>::cbegin
          (const_iterator *__return_storage_ptr__,compressed_sparse_matrix<int> *this,size_t index)

{
  unsigned_long __n;
  _Elt_pointer piVar1;
  _Elt_pointer piVar2;
  _Map_pointer ppiVar3;
  ulong uVar4;
  _Elt_pointer puVar5;
  ulong uVar6;
  _Self *__tmp;
  
  if (index == 0) {
    piVar1 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_first;
    __return_storage_ptr__->_M_cur =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_cur;
    __return_storage_ptr__->_M_first = piVar1;
    ppiVar3 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    __return_storage_ptr__->_M_last =
         (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
         ._M_start._M_last;
    __return_storage_ptr__->_M_node = ppiVar3;
    return __return_storage_ptr__;
  }
  piVar1 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
  piVar2 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  ppiVar3 = (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar5 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  uVar4 = ((long)puVar5 -
           (long)(this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + (index - 1);
  if ((long)uVar4 < 0) {
    uVar6 = (long)uVar4 >> 6;
  }
  else {
    if (uVar4 < 0x40) {
      puVar5 = puVar5 + (index - 1);
      goto LAB_00127d6f;
    }
    uVar6 = uVar4 >> 6;
  }
  puVar5 = (this->bounds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_start._M_node[uVar6] + uVar4 + uVar6 * -0x40;
LAB_00127d6f:
  __n = *puVar5;
  __return_storage_ptr__->_M_cur =
       (this->entries).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  __return_storage_ptr__->_M_first = piVar1;
  __return_storage_ptr__->_M_last = piVar2;
  __return_storage_ptr__->_M_node = ppiVar3;
  std::_Deque_iterator<int,_const_int_&,_const_int_*>::operator+=(__return_storage_ptr__,__n);
  return __return_storage_ptr__;
}

Assistant:

typename std::deque<ValueType>::const_iterator cbegin(size_t index) const {
		assert(index < size());
		return index == 0 ? entries.cbegin() : entries.cbegin() + bounds[index - 1];
	}